

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall
CLI::App::_parse_config(App *this,vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *args)

{
  pointer pCVar1;
  bool bVar2;
  ConfigError *__return_storage_ptr__;
  pointer item;
  string local_40;
  
  item = (args->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pCVar1 = (args->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (item == pCVar1) {
      return;
    }
    bVar2 = _parse_single_config(this,item,0);
    if ((!bVar2) && (this->allow_config_extras_ == error)) break;
    item = item + 1;
  }
  __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
  ConfigItem::fullname_abi_cxx11_(&local_40,item);
  ConfigError::Extras(__return_storage_ptr__,&local_40);
  __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
}

Assistant:

void _parse_config(const std::vector<ConfigItem> &args) {
        for(const ConfigItem &item : args) {
            if(!_parse_single_config(item) && allow_config_extras_ == config_extras_mode::error)
                throw ConfigError::Extras(item.fullname());
        }
    }